

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O2

BOOL Silent_ExtractFormatA
               (LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,LPINT Precision,LPINT Prefix,
               LPINT Type)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  BOOL BVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar4 = *Fmt;
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  if (*pcVar4 != '%') {
    return 0;
  }
  *Fmt = pcVar4 + 1;
  *Out = *pcVar4;
  sVar3 = strlen(*Fmt);
  pcVar4 = (char *)PAL_malloc(sVar3 + 1);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  do {
    pbVar9 = (byte *)Out + 1;
    pbVar6 = (byte *)*Fmt;
    bVar1 = *pbVar6;
    if (bVar1 == 0x20) {
      uVar8 = 8;
    }
    else if (bVar1 == 0x23) {
      uVar8 = 2;
    }
    else if (bVar1 == 0x30) {
      uVar8 = 4;
    }
    else {
      uVar8 = 1;
      if (bVar1 != 0x2d) {
        if (bVar1 != 0x2b) break;
        uVar8 = 0x10;
      }
    }
    *Flags = *Flags | uVar8;
    *Fmt = (LPCSTR)(pbVar6 + 1);
    *pbVar9 = *pbVar6;
    Out = (LPSTR)pbVar9;
  } while( true );
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
    bVar1 = *pbVar6;
  }
  iVar2 = isdigit((uint)bVar1);
  if (iVar2 == 0) {
    pbVar6 = (byte *)*Fmt;
    if (*pbVar6 == 0x2a) {
      *Width = -2;
      *Fmt = (LPCSTR)(pbVar6 + 1);
      ((byte *)Out)[1] = *pbVar6;
      pbVar9 = (byte *)Out + 2;
      iVar2 = isdigit((uint)(byte)**Fmt);
      if (iVar2 != 0) {
        *Width = -3;
        while (iVar2 = isdigit((uint)(byte)**Fmt), iVar2 != 0) {
          pbVar6 = (byte *)*Fmt;
          *Fmt = (LPCSTR)(pbVar6 + 1);
          *pbVar9 = *pbVar6;
          pbVar9 = pbVar9 + 1;
        }
      }
    }
  }
  else {
    lVar10 = 1;
    while (iVar2 = isdigit((uint)(byte)**Fmt), iVar2 != 0) {
      pcVar4[lVar10 + -1] = **Fmt;
      pbVar6 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar6 + 1);
      ((byte *)Out)[lVar10] = *pbVar6;
      lVar10 = lVar10 + 1;
    }
    pcVar4[lVar10 + -1] = '\0';
    iVar2 = atoi(pcVar4);
    *Width = iVar2;
    if (iVar2 < 0) goto LAB_001437b0;
    pbVar9 = (byte *)Out + lVar10;
  }
  pbVar6 = (byte *)*Fmt;
  if (*pbVar6 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar6 + 1);
    pbVar5 = pbVar9 + 1;
    *pbVar9 = *pbVar6;
    iVar2 = isdigit((uint)(byte)**Fmt);
    if (iVar2 == 0) {
      pbVar6 = (byte *)*Fmt;
      if (*pbVar6 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar6 + 1);
        pbVar9[1] = *pbVar6;
        pbVar9 = pbVar9 + 2;
        iVar2 = isdigit((uint)(byte)**Fmt);
        if (iVar2 != 0) {
          *Precision = -4;
          while (iVar2 = isdigit((uint)(byte)**Fmt), iVar2 != 0) {
            pbVar6 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar6 + 1);
            *pbVar9 = *pbVar6;
            pbVar9 = pbVar9 + 1;
          }
        }
      }
      else {
        *Precision = -3;
        pbVar9 = pbVar5;
      }
    }
    else {
      lVar10 = 0;
      while (iVar2 = isdigit((uint)(byte)**Fmt), iVar2 != 0) {
        pcVar4[lVar10] = **Fmt;
        pbVar6 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar6 + 1);
        pbVar5[lVar10] = *pbVar6;
        lVar10 = lVar10 + 1;
      }
      pcVar4[lVar10] = '\0';
      iVar2 = atoi(pcVar4);
      *Precision = iVar2;
      if (iVar2 < 0) {
LAB_001437b0:
        SetLastError(0x54f);
        return 0;
      }
      pbVar9 = pbVar5 + lVar10;
    }
  }
  pbVar6 = (byte *)*Fmt;
  bVar1 = *pbVar6;
  if (bVar1 == 0x70) {
    *Prefix = 3;
    bVar1 = *pbVar6;
  }
  if (bVar1 == 0x77) {
LAB_0014387e:
    pbVar5 = pbVar6 + 1;
    *Fmt = (LPCSTR)pbVar5;
    bVar1 = pbVar6[1];
    if ((bVar1 | 0x10) == 0x73) {
      *Prefix = 2;
      pbVar6 = pbVar5;
      goto LAB_001438aa;
    }
  }
  else {
    if (bVar1 != 0x4c) {
      if (bVar1 != 0x68) {
        if (bVar1 == 0x6c) goto LAB_0014387e;
        if (((bVar1 == 0x49) && (pbVar6[1] == 0x36)) && (pbVar6[2] == 0x34)) {
          pbVar6 = pbVar6 + 3;
          *Fmt = (LPCSTR)pbVar6;
          *Prefix = 3;
        }
        goto LAB_001438aa;
      }
      *Prefix = 1;
    }
    pbVar6 = pbVar6 + 1;
    *Fmt = (LPCSTR)pbVar6;
LAB_001438aa:
    bVar1 = *pbVar6;
    pbVar5 = pbVar6;
  }
  switch(bVar1) {
  case 99:
    goto switchD_001438c5_caseD_63;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
switchD_001438c5_caseD_64:
    *Type = 4;
    iVar2 = *Prefix;
    if (iVar2 == 3) {
      pbVar9[0] = 0x6c;
      pbVar9[1] = 0x6c;
      pbVar9 = pbVar9 + 2;
    }
    else {
      if (iVar2 == 2) {
        *pbVar9 = 0x6c;
      }
      else {
        if (iVar2 != 1) goto LAB_00143990;
        *pbVar9 = 0x68;
      }
      pbVar9 = pbVar9 + 1;
    }
LAB_00143990:
    pbVar5 = (byte *)*Fmt;
    goto LAB_00143993;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_001438c5_caseD_65:
    *Type = 7;
LAB_00143993:
    *Fmt = (LPCSTR)(pbVar5 + 1);
    *pbVar9 = *pbVar5;
    pbVar9 = pbVar9 + 1;
    goto LAB_00143a49;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_001438c5_caseD_68:
    BVar7 = 0;
    goto LAB_00143a4c;
  case 0x6e:
    if (*Prefix == 1) {
      *pbVar9 = 0x68;
      pbVar9 = pbVar9 + 1;
      pbVar5 = (byte *)*Fmt;
    }
    *Fmt = (LPCSTR)(pbVar5 + 1);
    *pbVar9 = *pbVar5;
    pbVar9 = pbVar9 + 1;
    *Type = 6;
    goto LAB_00143a49;
  case 0x70:
    *Type = 5;
    *Fmt = (LPCSTR)(pbVar5 + 1);
    *pbVar9 = *pbVar5;
    pbVar9 = pbVar9 + 1;
    BVar7 = 1;
    if (*Prefix == 3) {
      if (*Precision == -1) {
        *Precision = 0x10;
      }
    }
    else if (*Precision == -1) {
      *Precision = 8;
    }
    goto LAB_00143a4c;
  case 0x73:
switchD_001438c5_caseD_73:
    *Type = 2;
    if (*Prefix != 1) {
      if (*pbVar5 == 0x53) {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_00143a3e;
      *pbVar9 = 0x6c;
      pbVar9 = pbVar9 + 1;
    }
LAB_00143a3e:
    *pbVar9 = 0x73;
    goto LAB_00143a43;
  }
  if (bVar1 == 0x58) goto switchD_001438c5_caseD_64;
  if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_001438c5_caseD_65;
  if (bVar1 == 0x53) goto switchD_001438c5_caseD_73;
  if (bVar1 != 0x43) goto switchD_001438c5_caseD_68;
switchD_001438c5_caseD_63:
  *Type = 1;
  if (*Prefix != 1) {
    if (*pbVar5 == 0x43) {
      *Prefix = 2;
    }
    else if (*Prefix != 2) goto LAB_00143a2a;
    *pbVar9 = 0x6c;
    pbVar9 = pbVar9 + 1;
  }
LAB_00143a2a:
  *pbVar9 = 99;
LAB_00143a43:
  pbVar9 = pbVar9 + 1;
  *Fmt = *Fmt + 1;
LAB_00143a49:
  BVar7 = 1;
LAB_00143a4c:
  *pbVar9 = 0;
  PAL_free(pcVar4);
  return BVar7;
}

Assistant:

BOOL Silent_ExtractFormatA(LPCSTR *Fmt, LPSTR Out, LPINT Flags, LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) PAL_malloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a
                   number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    /* grab prefix of 'I64' for __int64 */
    if ((*Fmt)[0] == 'I' && (*Fmt)[1] == '6' && (*Fmt)[2] == '4')
    {
        /* convert to 'll' so BSD's snprintf can handle it */
        *Fmt += 3;
        *Prefix = PFF_PREFIX_LONGLONG;
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif       
        {
            *Prefix = PFF_PREFIX_LONG;
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        *Out++ = *(*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
            }
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
            }
        }
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    PAL_free(TempStr);
    return Result;
}